

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O1

void __thiscall
NativeEntryPointData::Cleanup
          (NativeEntryPointData *this,ScriptContext *scriptContext,bool isShutdown,bool reset)

{
  JitTransferData *this_00;
  BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  SList<Js::ConstructorCache_*,_Memory::Recycler,_RealCount> *this_02;
  
  this_00 = (this->jitTransferData).ptr;
  if (this_00 != (JitTransferData *)0x0) {
    (this->jitTransferData).ptr = (JitTransferData *)0x0;
    JitTransferData::Cleanup(this_00);
  }
  FreeNativeCode(this,scriptContext,isShutdown);
  InProcNativeEntryPointData::OnCleanup((InProcNativeEntryPointData *)this);
  ClearTypeRefsAndGuards(this,scriptContext);
  this_01 = (this->sharedPropertyGuards).ptr;
  if (this_01 !=
      (BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    if (!reset) {
      JsUtil::
      BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Clear(this_01);
    }
    (this->sharedPropertyGuards).ptr =
         (BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          *)0x0;
  }
  this_02 = &((this->constructorCaches).ptr)->
             super_SList<Js::ConstructorCache_*,_Memory::Recycler,_RealCount>;
  if (this_02 != (SList<Js::ConstructorCache_*,_Memory::Recycler,_RealCount> *)0x0) {
    if (!reset) {
      SList<Js::ConstructorCache_*,_Memory::Recycler,_RealCount>::Clear(this_02);
    }
    (this->constructorCaches).ptr = (SListCounted<Js::ConstructorCache_*,_Memory::Recycler> *)0x0;
  }
  (this->polymorphicInlineCacheInfo).ptr = (EntryPointPolymorphicInlineCacheInfo *)0x0;
  (this->weakFuncRefSet).ptr =
       (BaseHashSet<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  if (this->nativeThrowSpanSequence != (SmallSpanSequence *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::SmallSpanSequence>
              (&Memory::HeapAllocator::Instance,this->nativeThrowSpanSequence);
    this->nativeThrowSpanSequence = (Type)0x0;
  }
  JsUtil::
  List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Reset(&this->nativeOffsetMaps);
  return;
}

Assistant:

void
NativeEntryPointData::Cleanup(ScriptContext * scriptContext, bool isShutdown, bool reset)
{    
    this->FreeJitTransferData();
    this->FreeNativeCode(scriptContext, isShutdown);

    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        ((OOPNativeEntryPointData *)this)->OnCleanup();
    }
    else
    {
        ((InProcNativeEntryPointData *)this)->OnCleanup();
    }

    this->ClearTypeRefsAndGuards(scriptContext);

    if (this->sharedPropertyGuards != nullptr)
    {
        // Reset can be called on the background thread, don't clear it explicitly
        if (!reset)
        {
            sharedPropertyGuards->Clear();
        }
        sharedPropertyGuards = nullptr;
    }

    if (this->constructorCaches != nullptr)
    {
        // Reset can be called on the background thread, don't clear it explicitly
        if (!reset)
        {
            this->constructorCaches->Clear();
        }
        this->constructorCaches = nullptr;
    }

    this->polymorphicInlineCacheInfo = nullptr;
    this->weakFuncRefSet = nullptr;

    if (this->nativeThrowSpanSequence)
    {
        HeapDelete(this->nativeThrowSpanSequence);
        this->nativeThrowSpanSequence = nullptr;
    }

#if DBG_DUMP | defined(VTUNE_PROFILING)
    this->nativeOffsetMaps.Reset();
#endif
}